

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::FundamentalParameterData
          (FundamentalParameterData *this,KFLOAT32 Freq,KFLOAT32 FreqRange,
          KFLOAT32 EffectiveRadiatedPower,KFLOAT32 PulseRepetitionFreq,KFLOAT32 PulseWidth,
          KFLOAT32 BeamAzimuthCenter,KFLOAT32 BeamAzimuthSweep,KFLOAT32 BeamElevationCenter,
          KFLOAT32 BeamElevationSweep,KFLOAT32 BeamSweepSync)

{
  KFLOAT32 BeamElevationCenter_local;
  KFLOAT32 BeamAzimuthSweep_local;
  KFLOAT32 BeamAzimuthCenter_local;
  KFLOAT32 PulseWidth_local;
  KFLOAT32 PulseRepetitionFreq_local;
  KFLOAT32 EffectiveRadiatedPower_local;
  KFLOAT32 FreqRange_local;
  KFLOAT32 Freq_local;
  FundamentalParameterData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__FundamentalParameterData_0032d658;
  this->m_f32Freq = Freq;
  this->m_f32FreqRange = FreqRange;
  this->m_f32EffectiveRadiatedPower = EffectiveRadiatedPower;
  this->m_f32PulseRepetitionFreq = PulseRepetitionFreq;
  this->m_f32PulseWidth = PulseWidth;
  this->m_f32BeamAzimuthCenter = BeamAzimuthCenter;
  this->m_f32BeamAzimuthSweep = BeamAzimuthSweep;
  this->m_f32BeamElevationCenter = BeamElevationCenter;
  this->m_f32BeamElevationSweep = BeamElevationSweep;
  this->m_f32BeamSweepSync = BeamSweepSync;
  return;
}

Assistant:

FundamentalParameterData::FundamentalParameterData( KFLOAT32 Freq, KFLOAT32 FreqRange, KFLOAT32 EffectiveRadiatedPower,
        KFLOAT32 PulseRepetitionFreq, KFLOAT32 PulseWidth, KFLOAT32 BeamAzimuthCenter,
        KFLOAT32 BeamAzimuthSweep, KFLOAT32 BeamElevationCenter, KFLOAT32 BeamElevationSweep,
        KFLOAT32 BeamSweepSync ) :
    m_f32Freq( Freq ),
    m_f32FreqRange( FreqRange ),
    m_f32EffectiveRadiatedPower( EffectiveRadiatedPower ),
    m_f32PulseRepetitionFreq( PulseRepetitionFreq ),
    m_f32PulseWidth( PulseWidth ),
    m_f32BeamAzimuthCenter( BeamAzimuthCenter ),
    m_f32BeamAzimuthSweep( BeamAzimuthSweep ),
    m_f32BeamElevationCenter( BeamElevationCenter ),
    m_f32BeamElevationSweep( BeamElevationSweep ),
    m_f32BeamSweepSync( BeamSweepSync )
{
}